

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::InsertionSort<char16_t>
               (char16_t *list,uint32 length,CompareVarsInfo *cvInfo)

{
  bool bVar1;
  char16_t local_3a;
  uint local_38;
  uint uStack_34;
  char16_t item;
  uint32 upperBound;
  uint32 insertPoint;
  uint32 lowerBound;
  uint32 sortedCount;
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *compareType;
  CompareVarsInfo *cvInfo_local;
  char16_t *pcStack_10;
  uint32 length_local;
  char16_t *list_local;
  
  _lowerBound = cvInfo->compareType;
  compareType = (_func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *)cvInfo;
  cvInfo_local._4_4_ = length;
  pcStack_10 = list;
  for (insertPoint = 1; insertPoint < cvInfo_local._4_4_; insertPoint = insertPoint + 1) {
    local_3a = pcStack_10[insertPoint];
    local_38 = insertPoint;
    uStack_34 = insertPoint - 1;
    upperBound = 0;
    while( true ) {
      bVar1 = (*_lowerBound)((CompareVarsInfo *)compareType,&local_3a,pcStack_10 + uStack_34);
      if (bVar1) {
        local_38 = uStack_34;
      }
      else {
        upperBound = uStack_34 + 1;
      }
      if (local_38 <= upperBound) break;
      uStack_34 = upperBound + (local_38 - upperBound >> 1);
    }
    for (uStack_34 = insertPoint; upperBound < uStack_34; uStack_34 = uStack_34 - 1) {
      pcStack_10[uStack_34] = pcStack_10[uStack_34 - 1];
    }
    pcStack_10[upperBound] = local_3a;
  }
  return;
}

Assistant:

void JavascriptArray::InsertionSort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo)
    {
        bool (*compareType)(JavascriptArray::CompareVarsInfo*, const void*, const void*) = cvInfo->compareType;
        uint32 sortedCount = 1, lowerBound = 0, insertPoint = 0, upperBound = 0;
        T item;
        while (sortedCount < length)
        {
            item = list[sortedCount];
            upperBound = sortedCount;
            insertPoint = sortedCount - 1; // this lets us check for already ordered first
            lowerBound = 0;
            for (;;)
            {
                if (compareType (cvInfo, &item, &list[insertPoint]) )
                {
                    upperBound = insertPoint;
                }
                else
                {
                    lowerBound = insertPoint + 1;
                }
                if (lowerBound >= upperBound)
                {
                    break;
                }
                insertPoint = lowerBound + ((upperBound - lowerBound) / 2);
            }
            insertPoint = sortedCount;
            while (insertPoint > lowerBound)
            {
                list[insertPoint] = list[insertPoint - 1];
                --insertPoint;
            }
            list[lowerBound] = item;
            ++sortedCount;
        }
    }